

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O2

int uv_read_start(uv_stream_t *stream,uv_alloc_cb alloc_cb,uv_read_cb read_cb)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  
  iVar3 = -0x16;
  if ((read_cb != (uv_read_cb)0x0 && (alloc_cb != (uv_alloc_cb)0x0 && stream != (uv_stream_t *)0x0))
     && (uVar2 = stream->flags, (uVar2 & 1) == 0)) {
    if ((uVar2 >> 0xc & 1) != 0) {
      return -0x72;
    }
    if ((uVar2 >> 0xe & 1) != 0) {
      if ((UV_TTY < stream->type) || ((0x5080U >> (stream->type & (UV_SIGNAL|UV_UDP)) & 1) == 0)) {
        __assert_fail("stream->type == UV_TCP || stream->type == UV_NAMED_PIPE || stream->type == UV_TTY"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/stream.c"
                      ,0x59e,"int uv__read_start(uv_stream_t *, uv_alloc_cb, uv_read_cb)");
      }
      stream->flags = stream->flags & 0xffffe7ff | 0x1000;
      if ((stream->io_watcher).fd < 0) {
        __assert_fail("uv__stream_fd(stream) >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/stream.c"
                      ,0x5a6,"int uv__read_start(uv_stream_t *, uv_alloc_cb, uv_read_cb)");
      }
      if (alloc_cb != (uv_alloc_cb)0x0) {
        stream->read_cb = read_cb;
        stream->alloc_cb = alloc_cb;
        uv__io_start(stream->loop,&stream->io_watcher,1);
        uVar2 = stream->flags;
        if (((uVar2 & 4) == 0) && (stream->flags = uVar2 | 4, (uVar2 & 8) != 0)) {
          puVar1 = &stream->loop->active_handles;
          *puVar1 = *puVar1 + 1;
        }
        return 0;
      }
      __assert_fail("alloc_cb",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/stream.c"
                    ,0x5a7,"int uv__read_start(uv_stream_t *, uv_alloc_cb, uv_read_cb)");
    }
    iVar3 = -0x6b;
  }
  return iVar3;
}

Assistant:

int uv_read_start(uv_stream_t* stream,
                  uv_alloc_cb alloc_cb,
                  uv_read_cb read_cb) {
  if (stream == NULL || alloc_cb == NULL || read_cb == NULL)
    return UV_EINVAL;

  if (stream->flags & UV_HANDLE_CLOSING)
    return UV_EINVAL;

  if (stream->flags & UV_HANDLE_READING)
    return UV_EALREADY;

  if (!(stream->flags & UV_HANDLE_READABLE))
    return UV_ENOTCONN;

  return uv__read_start(stream, alloc_cb, read_cb);
}